

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send(Curl_easy *data,ssize_t len,size_t upload_size)

{
  size_t sStack_40;
  CURLcode result;
  ssize_t bytes_written;
  smb_conn *smbc;
  connectdata *conn;
  size_t upload_size_local;
  ssize_t len_local;
  Curl_easy *data_local;
  
  smbc = (smb_conn *)data->conn;
  bytes_written = (ssize_t)&((connectdata *)smbc)->proto;
  conn = (connectdata *)upload_size;
  upload_size_local = len;
  len_local = (ssize_t)data;
  data_local._4_4_ = Curl_nwrite(data,0,(data->state).ulbuf,len,(ssize_t *)&stack0xffffffffffffffc0)
  ;
  if (data_local._4_4_ == CURLE_OK) {
    if (sStack_40 != upload_size_local) {
      *(size_t *)(bytes_written + 0x40) = upload_size_local;
      *(size_t *)(bytes_written + 0x48) = sStack_40;
    }
    *(connectdata **)(bytes_written + 0x38) = conn;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send(struct Curl_easy *data, ssize_t len,
                         size_t upload_size)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  ssize_t bytes_written;
  CURLcode result;

  result = Curl_nwrite(data, FIRSTSOCKET, data->state.ulbuf,
                      len, &bytes_written);
  if(result)
    return result;

  if(bytes_written != len) {
    smbc->send_size = len;
    smbc->sent = bytes_written;
  }

  smbc->upload_size = upload_size;

  return CURLE_OK;
}